

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::cni_holder(cni_holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *this,_func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr
                   **func)

{
  function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_RDI;
  cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *this_00;
  function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_ffffffffffffffc0;
  _func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr
  *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003b8da0;
  this_00 = (cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::
  function<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&)>
  ::
  function<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*const&)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::cni_helper(this_00,in_RDI);
  std::
  function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::~function((function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
               *)0x26cef6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}